

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Loader.cpp
# Opt level: O0

void __thiscall
Assimp::MD5Importer::InternReadFile
          (MD5Importer *this,string *pFile,aiScene *_pScene,IOSystem *_pIOHandler)

{
  bool bVar1;
  long lVar2;
  DeadlyImportError *pDVar3;
  aiMatrix4x4t<float> local_10c;
  undefined1 local_ca;
  allocator local_c9;
  string local_c8;
  undefined1 local_a2;
  allocator local_a1;
  string local_a0;
  undefined1 local_80 [8];
  string extension;
  string local_50 [32];
  long local_30;
  size_type pos;
  IOSystem *_pIOHandler_local;
  aiScene *_pScene_local;
  string *pFile_local;
  MD5Importer *this_local;
  
  this->pIOHandler = _pIOHandler;
  this->pScene = _pScene;
  this->bHadMD5Camera = false;
  this->bHadMD5Anim = false;
  this->bHadMD5Mesh = false;
  pos = (size_type)_pIOHandler;
  _pIOHandler_local = (IOSystem *)_pScene;
  _pScene_local = (aiScene *)pFile;
  pFile_local = (string *)this;
  local_30 = std::__cxx11::string::find_last_of((char)pFile,0x2e);
  if (local_30 == -1) {
    std::__cxx11::string::string(local_50,(string *)_pScene_local);
  }
  else {
    std::__cxx11::string::substr((ulong)local_50,(ulong)_pScene_local);
  }
  std::__cxx11::string::operator=((string *)&this->mFile,local_50);
  std::__cxx11::string::~string(local_50);
  BaseImporter::GetExtension((string *)local_80,(string *)_pScene_local);
  bVar1 = std::operator==((string *)local_80,"md5camera");
  if (bVar1) {
    LoadMD5CameraFile(this);
  }
  else if (((this->configNoAutoLoad & 1U) != 0) ||
          (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_80,"md5anim"), bVar1)) {
    lVar2 = std::__cxx11::string::length();
    if (lVar2 == 0) {
      local_a2 = 1;
      pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_a0,"Failure, need file extension to determine MD5 part type",
                 &local_a1);
      DeadlyImportError::DeadlyImportError(pDVar3,&local_a0);
      local_a2 = 0;
      __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_80,"md5anim");
    if (bVar1) {
      LoadMD5AnimFile(this);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_80,"md5mesh");
      if (bVar1) {
        LoadMD5MeshFile(this);
      }
    }
  }
  else {
    LoadMD5MeshFile(this);
    LoadMD5AnimFile(this);
  }
  if ((((this->bHadMD5Mesh & 1U) == 0) && ((this->bHadMD5Anim & 1U) == 0)) &&
     ((this->bHadMD5Camera & 1U) == 0)) {
    local_ca = 1;
    pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_c8,"Failed to read valid contents out of this MD5* file",&local_c9);
    DeadlyImportError::DeadlyImportError(pDVar3,&local_c8);
    local_ca = 0;
    __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  aiMatrix4x4t<float>::aiMatrix4x4t
            (&local_10c,1.0,0.0,0.0,0.0,0.0,0.0,1.0,0.0,0.0,-1.0,0.0,0.0,0.0,0.0,0.0,1.0);
  memcpy(&this->pScene->mRootNode->mTransformation,&local_10c,0x40);
  if ((this->bHadMD5Mesh & 1U) == 0) {
    this->pScene->mFlags = this->pScene->mFlags | 1;
  }
  UnloadFileFromMemory(this);
  std::__cxx11::string::~string((string *)local_80);
  return;
}

Assistant:

void MD5Importer::InternReadFile( const std::string& pFile,
                                 aiScene* _pScene, IOSystem* _pIOHandler)
{
    pIOHandler = _pIOHandler;
    pScene     = _pScene;
    bHadMD5Mesh = bHadMD5Anim = bHadMD5Camera = false;

    // remove the file extension
    const std::string::size_type pos = pFile.find_last_of('.');
    mFile = (std::string::npos == pos ? pFile : pFile.substr(0,pos+1));

    const std::string extension = GetExtension(pFile);
    try {
        if (extension == "md5camera") {
            LoadMD5CameraFile();
        }
        else if (configNoAutoLoad || extension == "md5anim") {
            // determine file extension and process just *one* file
            if (extension.length() == 0) {
                throw DeadlyImportError("Failure, need file extension to determine MD5 part type");
            }
            if (extension == "md5anim") {
                LoadMD5AnimFile();
            }
            else if (extension == "md5mesh") {
                LoadMD5MeshFile();
            }
        }
        else {
            LoadMD5MeshFile();
            LoadMD5AnimFile();
        }
    }
    catch ( ... ) { // std::exception, Assimp::DeadlyImportError
        UnloadFileFromMemory();
        throw;
    }

    // make sure we have at least one file
    if (!bHadMD5Mesh && !bHadMD5Anim && !bHadMD5Camera) {
        throw DeadlyImportError("Failed to read valid contents out of this MD5* file");
    }

    // Now rotate the whole scene 90 degrees around the x axis to match our internal coordinate system
    pScene->mRootNode->mTransformation = aiMatrix4x4(1.f,0.f,0.f,0.f,
        0.f,0.f,1.f,0.f,0.f,-1.f,0.f,0.f,0.f,0.f,0.f,1.f);

    // the output scene wouldn't pass the validation without this flag
    if (!bHadMD5Mesh) {
        pScene->mFlags |= AI_SCENE_FLAGS_INCOMPLETE;
    }

    // clean the instance -- the BaseImporter instance may be reused later.
    UnloadFileFromMemory();
}